

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCInstPrinter.c
# Opt level: O0

void printPredicateOperand(MCInst *MI,uint OpNo,SStream *O,char *Modifier)

{
  int cc;
  arm64_cc aVar1;
  int iVar2;
  MCOperand *op;
  int64_t iVar3;
  uint Code;
  char *Modifier_local;
  SStream *O_local;
  uint OpNo_local;
  MCInst *MI_local;
  
  op = MCInst_getOperand(MI,OpNo);
  iVar3 = MCOperand_getImm(op);
  cc = (int)iVar3;
  aVar1 = cc_normalize(cc);
  (MI->flat_insn->detail->field_6).arm64.cc = aVar1;
  iVar2 = strcmp(Modifier,"cc");
  if (iVar2 == 0) {
    if ((cc == 4) || (cc - 6U < 2)) {
      SStream_concat0(O,"ge");
      return;
    }
    if ((cc != 0xc) && (1 < cc - 0xeU)) {
      if ((cc == 0x24) || (cc - 0x26U < 2)) {
        SStream_concat0(O,"le");
        return;
      }
      if ((cc == 0x2c) || (cc - 0x2eU < 2)) {
        SStream_concat0(O,"gt");
        return;
      }
      if ((cc == 0x44) || (cc - 0x46U < 2)) {
        SStream_concat0(O,"ne");
        return;
      }
      if ((cc == 0x4c) || (cc - 0x4eU < 2)) {
        SStream_concat0(O,"eq");
        return;
      }
      if ((cc == 100) || (cc - 0x66U < 2)) {
        SStream_concat0(O,"nu");
        return;
      }
      if ((cc == 0x6c) || (cc - 0x6eU < 2)) {
        SStream_concat0(O,"un");
        return;
      }
      if (cc - 0x400U < 2) {
        SStream_concat0(O,"invalid-predicate");
        return;
      }
    }
    SStream_concat0(O,"lt");
    return;
  }
  iVar2 = strcmp(Modifier,"pm");
  if (iVar2 != 0) {
    printOperand(MI,OpNo + 1,O);
    return;
  }
  if (cc == 4) {
    return;
  }
  if (cc == 6) {
LAB_001f76ec:
    SStream_concat0(O,"-");
  }
  else {
    if (cc != 7) {
      if (cc == 0xc) {
        return;
      }
      if (cc == 0xe) goto LAB_001f76ec;
      if (cc != 0xf) {
        if (cc == 0x24) {
          return;
        }
        if (cc == 0x26) goto LAB_001f76ec;
        if (cc != 0x27) {
          if (cc == 0x2c) {
            return;
          }
          if (cc == 0x2e) goto LAB_001f76ec;
          if (cc != 0x2f) {
            if (cc == 0x44) {
              return;
            }
            if (cc == 0x46) goto LAB_001f76ec;
            if (cc != 0x47) {
              if (cc == 0x4c) {
                return;
              }
              if (cc == 0x4e) goto LAB_001f76ec;
              if (cc != 0x4f) {
                if (cc == 100) {
                  return;
                }
                if (cc == 0x66) goto LAB_001f76ec;
                if (cc != 0x67) {
                  if (cc == 0x6c) {
                    return;
                  }
                  if (cc == 0x6e) goto LAB_001f76ec;
                  if (cc != 0x6f) {
                    if (1 < cc - 0x400U) {
                      return;
                    }
                    SStream_concat0(O,"invalid-predicate");
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
    SStream_concat0(O,"+");
  }
  return;
}

Assistant:

static void printPredicateOperand(MCInst *MI, unsigned OpNo,
		SStream *O, const char *Modifier)
{
	unsigned Code = (unsigned int)MCOperand_getImm(MCInst_getOperand(MI, OpNo));

	MI->flat_insn->detail->ppc.bc = (ppc_bc)cc_normalize(Code);

	if (!strcmp(Modifier, "cc")) {
		switch ((ppc_predicate)Code) {
			default:	// unreachable
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LT:
				SStream_concat0(O, "lt");
				return;
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_LE:
				SStream_concat0(O, "le");
				return;
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_EQ:
				SStream_concat0(O, "eq");
				return;
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GE:
				SStream_concat0(O, "ge");
				return;
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_GT:
				SStream_concat0(O, "gt");
				return;
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_NE:
				SStream_concat0(O, "ne");
				return;
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_UN:
				SStream_concat0(O, "un");
				return;
			case PPC_PRED_NU_MINUS:
			case PPC_PRED_NU_PLUS:
			case PPC_PRED_NU:
				SStream_concat0(O, "nu");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
		}
	}

	if (!strcmp(Modifier, "pm")) {
		switch ((ppc_predicate)Code) {
			case PPC_PRED_LT:
			case PPC_PRED_LE:
			case PPC_PRED_EQ:
			case PPC_PRED_GE:
			case PPC_PRED_GT:
			case PPC_PRED_NE:
			case PPC_PRED_UN:
			case PPC_PRED_NU:
				return;
			case PPC_PRED_LT_MINUS:
			case PPC_PRED_LE_MINUS:
			case PPC_PRED_EQ_MINUS:
			case PPC_PRED_GE_MINUS:
			case PPC_PRED_GT_MINUS:
			case PPC_PRED_NE_MINUS:
			case PPC_PRED_UN_MINUS:
			case PPC_PRED_NU_MINUS:
				SStream_concat0(O, "-");
				return;
			case PPC_PRED_LT_PLUS:
			case PPC_PRED_LE_PLUS:
			case PPC_PRED_EQ_PLUS:
			case PPC_PRED_GE_PLUS:
			case PPC_PRED_GT_PLUS:
			case PPC_PRED_NE_PLUS:
			case PPC_PRED_UN_PLUS:
			case PPC_PRED_NU_PLUS:
				SStream_concat0(O, "+");
				return;
			case PPC_PRED_BIT_SET:
			case PPC_PRED_BIT_UNSET:
				// llvm_unreachable("Invalid use of bit predicate code");
				SStream_concat0(O, "invalid-predicate");
				return;
			default:	// unreachable
				return;
		}
		// llvm_unreachable("Invalid predicate code");
	}

	//assert(StringRef(Modifier) == "reg" &&
	//		"Need to specify 'cc', 'pm' or 'reg' as predicate op modifier!");
	printOperand(MI, OpNo + 1, O);
}